

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintIo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pNode_00;
  char *pcVar2;
  uint local_40;
  int fPrintFlops;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_40 = 1;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"fh"), iVar1 != -1) {
    if (iVar1 != 0x66) goto LAB_00226180;
    local_40 = local_40 ^ 1;
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else if (globalUtilOptind + 1 < argc) {
    Abc_Print(-1,"Wrong number of auguments.\n");
LAB_00226180:
    Abc_Print(-2,"usage: print_io [-fh] <node>\n");
    Abc_Print(-2,"\t        prints the PIs/POs/flops or fanins/fanouts of a node\n");
    pcVar2 = "no";
    if (local_40 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-f    : toggles printing flops [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    Abc_Print(-2,"\tnode  : the node to print fanins/fanouts\n");
    pAbc_local._4_4_ = 1;
  }
  else if (argc == globalUtilOptind + 1) {
    pNode_00 = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
    if (pNode_00 == (Abc_Obj_t *)0x0) {
      Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_NodePrintFanio(_stdout,pNode_00);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_NtkPrintIo(_stdout,pNtk_00,local_40);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandPrintIo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c, fPrintFlops = 1;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fPrintFlops ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintFanio( stdout, pNode );
        return 0;
    }
    // print the nodes
    Abc_NtkPrintIo( stdout, pNtk, fPrintFlops );
    return 0;

usage:
    Abc_Print( -2, "usage: print_io [-fh] <node>\n" );
    Abc_Print( -2, "\t        prints the PIs/POs/flops or fanins/fanouts of a node\n" );
    Abc_Print( -2, "\t-f    : toggles printing flops [default = %s]\n", fPrintFlops? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : the node to print fanins/fanouts\n");
    return 1;
}